

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::OP1aHeader::~OP1aHeader(OP1aHeader *this)

{
  OP1aHeader *this_local;
  
  ~OP1aHeader(this);
  operator_delete(this,0x218);
  return;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::OP1aHeader::InitFromFile(const Kumu::IFileReader& Reader)
{
  Result_t result = Partition::InitFromFile(Reader);

  if ( ASDCP_FAILURE(result) )
    return result;

  if ( m_Dict == &DefaultCompositeDict() )
    {
      // select more explicit dictionary if one is available
      if ( OperationalPattern.MatchExact(MXFInterop_OPAtom_Entry().ul) )
	{
	  m_Dict = &DefaultInteropDict();
	}
      else if ( OperationalPattern.MatchExact(SMPTE_390_OPAtom_Entry().ul) )
	{
	  m_Dict = &DefaultSMPTEDict();
	}
    }

  // slurp up the remainder of the header
  if ( HeaderByteCount == 0 )
    {
      DefaultLogSink().Warn("MXF file contents incomplete.\n");
      return RESULT_KLV_CODING(__LINE__, __FILE__);
    }
  else if ( HeaderByteCount < 1024 )
    {
      DefaultLogSink().Warn("Improbably small HeaderByteCount value: %qu\n", HeaderByteCount);
    }
  else if (HeaderByteCount > ( 4 * Kumu::Megabyte ) )
    {
      DefaultLogSink().Warn("Improbably huge HeaderByteCount value: %qu\n", HeaderByteCount);
    }
  
  result = m_HeaderData.Capacity(Kumu::xmin(4*Kumu::Megabyte, static_cast<ui32_t>(HeaderByteCount)));

  if ( ASDCP_SUCCESS(result) )
    {
      ui32_t read_count;
      result = Reader.Read(m_HeaderData.Data(), m_HeaderData.Capacity(), &read_count);

      if ( ASDCP_FAILURE(result) )
        {
	  DefaultLogSink().Error("OP1aHeader::InitFromFile, read failed.\n");
	  return result;
        }

      if ( read_count != m_HeaderData.Capacity() )
	{
	  DefaultLogSink().Error("Short read of OP-Atom header metadata; wanted %u, got %u.\n",
				 m_HeaderData.Capacity(), read_count);
	  return RESULT_KLV_CODING(__LINE__, __FILE__);
	}
    }

  if ( ASDCP_SUCCESS(result) )
    result = InitFromBuffer(m_HeaderData.RoData(), m_HeaderData.Capacity());

  return result;
}